

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

mcmodef * mcmoal(mcmcx1def *ctx,mcmon *nump)

{
  ushort uVar1;
  mcmodef *pmVar2;
  uchar *puVar3;
  ushort *in_RSI;
  errcxdef *in_RDI;
  uint pagenum;
  mcmodef *ret;
  char *in_stack_ffffffffffffffe0;
  
  while( true ) {
    if (*(short *)(in_RDI->errcxbuf + 0x52) != -1) {
      *in_RSI = *(ushort *)(in_RDI->errcxbuf + 0x52);
      pmVar2 = (mcmodef *)
               (*(long *)(in_RDI->errcxptr->errfac + (long)((int)(uint)*in_RSI >> 8) * 8 + -0xc) +
               (long)(int)(*in_RSI & 0xff) * 0x20);
      *(mcmon *)(in_RDI->errcxbuf + 0x52) = pmVar2->mcmonxt;
      (pmVar2->mcmoloc).mcmolocs = 0xffff;
      return pmVar2;
    }
    if (*(short *)(in_RDI->errcxbuf + 0x54) == *(short *)(in_RDI->errcxbuf + 0x56)) break;
    uVar1 = *(ushort *)(in_RDI->errcxbuf + 0x54);
    *(ushort *)(in_RDI->errcxbuf + 0x54) = uVar1 + 1;
    puVar3 = mchalo(in_RDI,(size_t)in_RSI,in_stack_ffffffffffffffe0);
    *(uchar **)(in_RDI->errcxptr->errfac + (ulong)(uint)uVar1 * 8 + -0xc) = puVar3;
    mcmadpg((mcmcx1def *)in_RDI,(uint)uVar1,0xffff);
  }
  *in_RSI = 0xffff;
  return (mcmodef *)0x0;
}

Assistant:

static mcmodef *mcmoal(mcmcx1def *ctx, mcmon *nump)
{
    mcmodef  *ret;
    uint      pagenum;
    
    MCMGLBCTX(ctx);
    
    /* look first in list of unused headers */
startover:
    if (ctx->mcmcxunu != MCMONINV)
    {
        /* we have something in the unused list; return it */
        *nump = ctx->mcmcxunu;
        ret = mcmgobje(ctx, *nump);
        ctx->mcmcxunu = ret->mcmonxt;
        ret->mcmoswh = MCSSEGINV;
        return(ret);
    }
    
    /*
     *   No unused entries: we must create a new page.  To do so, we
     *   simply allocate memory for a new page.  Allocate the memory
     *   ourselves, to avoid deadlocking with the allocator (which can
     *   try to get a new entry to satisfy our request for memory).
     */
    if (ctx->mcmcxpage == ctx->mcmcxpgmx) goto error;      /* no more pages */
    pagenum = ctx->mcmcxpage++;                      /* get a new page slot */
    
    ctx->mcmcxtab[pagenum] =
         (mcmodef *)mchalo(ctx->mcmcxerr, MCMPAGESIZE, "mcmoal");
    mcmadpg(ctx, pagenum, MCMONINV);
    goto startover;

error:
    *nump = MCMONINV;
    return((mcmodef *)0);
}